

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Performance::getNameSpecialization_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,deUint32 id)

{
  string local_38;
  uint local_14;
  string *psStack_10;
  deUint32 id_local;
  
  local_14 = (uint)this;
  psStack_10 = __return_storage_ptr__;
  toStringWithPadding<unsigned_int>(&local_38,local_14,10);
  std::operator+(__return_storage_ptr__,"_",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string getNameSpecialization (deUint32 id)
{
	return "_" + toStringWithPadding(id, 10);
}